

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O0

RK_S32 mpi_enc_opt_atf(void *ctx,char *next)

{
  int iVar1;
  RK_S32 val;
  MpiEncTestArgs *cmd;
  char *next_local;
  void *ctx_local;
  
  if (next == (char *)0x0) {
    _mpp_log_l(2,"mpi_enc_utils","invalid cu_qp_delta_depth\n",0);
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = atoi(next);
    if ((iVar1 < 0) || (3 < iVar1)) {
      *(undefined4 *)((long)ctx + 0xb4) = 0;
      *(undefined4 *)((long)ctx + 0xb8) = 0;
      _mpp_log_l(2,"mpi_enc_utils","invalid atf_str %d set to default 0\n",0,iVar1);
    }
    else {
      *(int *)((long)ctx + 0xb4) = iVar1;
      *(int *)((long)ctx + 0xb8) = iVar1;
    }
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

RK_S32 mpi_enc_opt_atf(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        RK_S32 val = atoi(next);

        if (val >= 0 && val <= 3 ) {
            cmd->anti_flicker_str = val;
            cmd->atf_str = val;
        } else {
            cmd->anti_flicker_str = 0;
            cmd->atf_str = 0;
            mpp_err("invalid atf_str %d set to default 0\n", val);
        }
        return 1;
    }

    mpp_err("invalid cu_qp_delta_depth\n");
    return 0;
}